

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O1

string_t __thiscall duckdb::IntToVarInt<long>(duckdb *this,Vector *result,long int_value)

{
  undefined1 *puVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  idx_t extraout_RDX;
  Vector *pVVar6;
  char *blob_00;
  uint uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  string_t blob;
  undefined1 local_48 [16];
  ulong local_38;
  
  pVVar6 = (Vector *)-(long)result;
  if (0 < (long)result) {
    pVVar6 = result;
  }
  if (result == (Vector *)0x0) {
    uVar7 = 1;
  }
  else {
    puVar1 = &pVVar6->field_0x1;
    auVar9._8_4_ = (int)((ulong)puVar1 >> 0x20);
    auVar9._0_8_ = puVar1;
    auVar9._12_4_ = 0x45300000;
    dVar8 = log2((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)puVar1) - 4503599627370496.0));
    dVar8 = ceil(dVar8 * 0.125);
    uVar7 = (uint)(long)dVar8;
    int_value = extraout_RDX;
  }
  local_48 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)this,(Vector *)(ulong)(uVar7 + 3),int_value);
  blob_00 = local_48._8_8_;
  if (local_48._0_4_ < 0xd) {
    blob_00 = local_48 + 4;
  }
  local_38 = (ulong)uVar7;
  bVar2 = (byte)((ulong)result >> 0x38);
  Varint::SetHeader(blob_00,local_38,(bool)(bVar2 >> 7));
  if (0 < (int)uVar7) {
    lVar5 = local_38 * 8;
    lVar3 = 3;
    do {
      lVar5 = lVar5 + -8;
      blob_00[lVar3] = (byte)((ulong)pVVar6 >> ((byte)lVar5 & 0x3f)) ^ (char)bVar2 >> 7;
      lVar3 = lVar3 + 1;
    } while ((Vector *)(ulong)(uVar7 + 3) != (Vector *)lVar3);
  }
  uVar4 = (ulong)(uint)local_48._0_4_;
  if (uVar4 < 0xd) {
    switchD_01306cb1::default(local_48 + 4 + uVar4,0,0xc - uVar4);
  }
  else {
    local_48._4_4_ = *(undefined4 *)local_48._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_48;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}